

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

int __thiscall Matrix::copy(Matrix *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  int *piVar8;
  double *pdVar9;
  shared_array<double> *psVar10;
  Physical *pPVar11;
  ulong uVar12;
  Physical *local_118;
  int local_e8;
  MatrixDataDeleter local_e1;
  int i_3;
  int local_d0;
  int local_cc;
  int i_2;
  int i_1;
  int local_30;
  int i;
  byte local_19;
  EVP_PKEY_CTX *pEStack_18;
  bool deep_local;
  Matrix *m_local;
  Matrix *this_local;
  
  local_19 = (byte)src & 1;
  pEStack_18 = dst;
  m_local = this;
  std::__cxx11::string::operator=((string *)&this->sMatrixName,(string *)(dst + 0xe0));
  this->nMatrixDimension = *(int *)(pEStack_18 + 0xd8);
  this->nData = *(int *)(pEStack_18 + 0xb8);
  this->bReference = (bool)((local_19 & 1) - 1 & 1);
  std::__cxx11::string::operator=
            ((string *)&(this->super_Physical).physicalDescription,(string *)(pEStack_18 + 8));
  std::__cxx11::string::operator=((string *)&this->sMatrixName,(string *)(pEStack_18 + 0xe0));
  Unit::operator=(&(this->super_Physical).physicalUnit,(Unit *)(pEStack_18 + 0x30));
  uVar5 = (ulong)this->nMatrixDimension;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x98),0);
  uVar12 = uVar6 + 8;
  if (SUB168(auVar1 * ZEXT816(0x98),8) != 0 || 0xfffffffffffffff7 < uVar6) {
    uVar12 = 0xffffffffffffffff;
  }
  puVar7 = (ulong *)operator_new__(uVar12);
  *puVar7 = uVar5;
  pPVar11 = (Physical *)(puVar7 + 1);
  if (uVar5 != 0) {
    local_118 = pPVar11;
    do {
      Physical::Physical(local_118);
      local_118 = local_118 + 1;
    } while (local_118 != pPVar11 + uVar5);
  }
  this->pPhysicals = pPVar11;
  for (local_30 = 0; local_30 < this->nMatrixDimension; local_30 = local_30 + 1) {
    Physical::Physical((Physical *)&i_2,
                       (Physical *)(*(long *)(pEStack_18 + 0xd0) + (long)local_30 * 0x98));
    Physical::operator=(this->pPhysicals + local_30,(Physical *)&i_2);
    Physical::~Physical((Physical *)&i_2);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->nMatrixDimension;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar5);
  this->pSize = piVar8;
  for (local_cc = 0; local_cc < this->nMatrixDimension; local_cc = local_cc + 1) {
    this->pSize[local_cc] = *(int *)(*(long *)(pEStack_18 + 0xc0) + (long)local_cc * 4);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->nMatrixDimension;
  uVar5 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  piVar8 = (int *)operator_new__(uVar5);
  this->pMult = piVar8;
  for (local_d0 = 0; local_d0 < this->nMatrixDimension; local_d0 = local_d0 + 1) {
    this->pMult[local_d0] = *(int *)(*(long *)(pEStack_18 + 200) + (long)local_d0 * 4);
  }
  if ((this->bReference & 1U) == 0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)this->nData;
    uVar5 = SUB168(auVar4 * ZEXT816(8),0);
    if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar9 = (double *)operator_new__(uVar5);
    this->pData = pdVar9;
    pdVar9 = this->pData;
    MatrixDataDeleter::MatrixDataDeleter(&local_e1,this);
    boost::shared_array<double>::shared_array<double,MatrixDataDeleter>
              ((shared_array<double> *)&i_3,pdVar9,local_e1);
    boost::shared_array<double>::operator=(&this->matrixParent,(shared_array<double> *)&i_3);
    boost::shared_array<double>::~shared_array((shared_array<double> *)&i_3);
    for (local_e8 = 0; local_e8 < this->nData; local_e8 = local_e8 + 1) {
      this->pData[local_e8] = *(double *)(*(long *)(pEStack_18 + 0xa0) + (long)local_e8 * 8);
    }
  }
  else {
    this->pData = *(double **)(pEStack_18 + 0xa0);
    psVar10 = boost::shared_array<double>::operator=
                        (&this->matrixParent,(shared_array<double> *)(pEStack_18 + 0xa8));
    local_e8 = (int)psVar10;
  }
  return local_e8;
}

Assistant:

void Matrix::copy( const Matrix &m, bool deep )
{
	// copy main variables
	sMatrixName = m.sMatrixName;
	nMatrixDimension = m.nMatrixDimension;
	nData = m.nData;
	bReference = deep ? false : true;
	physicalDescription = m.physicalDescription;
	sMatrixName = m.sMatrixName;
	physicalUnit = m.physicalUnit;
	
	pPhysicals = new Physical[nMatrixDimension]();
	for( int i=0; i<nMatrixDimension; i++)
		pPhysicals[i] = Physical(m.pPhysicals[i]);

	pSize = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pSize[i] = m.pSize[i];

	pMult = new int[nMatrixDimension];
	for( int i=0; i<nMatrixDimension; i++ )
		pMult[i] = m.pMult[i];		

	// copy all content if deep copy is wanted
	if( !bReference ) {
		pData = new double[nData];
		matrixParent =  shared_array<double>(pData, MatrixDataDeleter(this));
		for( int i=0; i<nData; i++ )
			pData[i] = m.pData[i];
	}
	// else copy only pointers
	else {
		pData = m.pData;
		matrixParent = m.matrixParent;
	}
}